

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::foo(TestInterfaceImpl *this,FooContext context)

{
  bool bVar1;
  int32_t iVar2;
  ArrayPtr<const_char> local_138;
  bool local_123;
  bool local_122;
  DebugExpression<bool> local_121;
  uint32_t local_120;
  bool _kj_shouldLog_2;
  int iStack_11c;
  DebugExpression<bool> _kjCondition_2;
  bool local_115;
  uint32_t local_114;
  int iStack_110;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_10c;
  undefined1 local_108 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  Maybe<capnp::MessageSize> local_d0;
  undefined1 local_b8 [8];
  Builder result;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_88;
  undefined1 local_80 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  Reader params;
  uint sequence;
  TestInterfaceImpl *this_local;
  FooContext context_local;
  
  params._reader._44_4_ = *(undefined4 *)context.hook[1]._vptr_CallContextHook;
  *(int *)context.hook[1]._vptr_CallContextHook = params._reader._44_4_ + 1;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::getParams((Reader *)&_kjCondition.result,
              (CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
               *)&this_local);
  iVar2 = capnproto_test::capnp::test::TestInterface::FooParams::Reader::getExpectedCallCount
                    ((Reader *)&_kjCondition.result);
  if (-1 < iVar2) {
    DStack_88 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (uint *)&params._reader.field_0x2c);
    result._builder._36_4_ =
         capnproto_test::capnp::test::TestInterface::FooParams::Reader::getExpectedCallCount
                   ((Reader *)&_kjCondition.result);
    kj::_::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_80,
               (DebugExpression<unsigned_int&> *)&stack0xffffffffffffff78,
               (int *)&result._builder.pointerCount);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
    if (!bVar1) {
      result._builder.dataSize._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)result._builder.dataSize._3_1_ != false) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<unsigned_int&,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,900,ERROR,
                   "\"failed: expected \" \"sequence == params.getExpectedCallCount()\", _kjCondition"
                   ,(char (*) [59])"failed: expected sequence == params.getExpectedCallCount()",
                   (DebugComparison<unsigned_int_&,_int> *)local_80);
        result._builder.dataSize._3_1_ = false;
      }
    }
  }
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::getResults((Builder *)local_b8,
               (CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
                *)&this_local,&local_d0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_d0);
  iStack_110 = 0x7b;
  local_10c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffef0);
  local_114 = capnproto_test::capnp::test::TestInterface::FooParams::Reader::getI
                        ((Reader *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_108,&local_10c,&local_114);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
  if (!bVar1) {
    local_115 = kj::_::Debug::shouldLog(ERROR);
    while (local_115 != false) {
      iStack_11c = 0x7b;
      local_120 = capnproto_test::capnp::test::TestInterface::FooParams::Reader::getI
                            ((Reader *)&_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[42],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x387,ERROR,
                 "\"failed: expected \" \"(123) == (params.getI())\", _kjCondition, 123, params.getI()"
                 ,(char (*) [42])"failed: expected (123) == (params.getI())",
                 (DebugComparison<int,_unsigned_int> *)local_108,&stack0xfffffffffffffee4,&local_120
                );
      local_115 = false;
    }
  }
  local_122 = capnproto_test::capnp::test::TestInterface::FooParams::Reader::getJ
                        ((Reader *)&_kjCondition.result);
  local_121 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_122);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_121);
  if (!bVar1) {
    local_123 = kj::_::Debug::shouldLog(ERROR);
    while (local_123 != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x388,ERROR,"\"failed: expected \" \"params.getJ()\", _kjCondition",
                 (char (*) [31])"failed: expected params.getJ()",&local_121);
      local_123 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_138,"foo");
  capnproto_test::capnp::test::TestInterface::FooResults::Builder::setX
            ((Builder *)local_b8,(Reader)local_138);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::foo(FooContext context) {
  uint sequence = callCount++;
  auto params = context.getParams();
  if (params.getExpectedCallCount() >= 0) {
    KJ_EXPECT(sequence == params.getExpectedCallCount());
  }
  auto result = context.getResults();
  EXPECT_EQ(123, params.getI());
  EXPECT_TRUE(params.getJ());
  result.setX("foo");
  return kj::READY_NOW;
}